

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall Attribute::SetDataSize(Attribute *this)

{
  size_type sVar1;
  reference this_00;
  size_t sVar2;
  size_t sVar3;
  ulong local_20;
  size_t i;
  size_t cbNeeded;
  Attribute *this_local;
  
  i = 0;
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<AnyType,_std::allocator<AnyType>_>::size(&this->attrValues);
    if (sVar1 <= local_20) break;
    this_00 = std::vector<AnyType,_std::allocator<AnyType>_>::operator[](&this->attrValues,local_20)
    ;
    sVar2 = AnyType::EncodedSize(this_00);
    i = sVar2 + i;
    local_20 = local_20 + 1;
  }
  sVar2 = GetSizeBytes(i);
  sVar3 = DerBase::EncodedSize(&(this->attrType).super_DerBase);
  sVar3 = sVar3 + sVar2 + 1 + i;
  (this->super_DerBase).cbData = sVar3;
  return sVar3;
}

Assistant:

virtual size_t SetDataSize() override
	{
		size_t cbNeeded = 0; // For the set byte

		// First, calculate how much is needed for the set of attrValues
		for (size_t i = 0; i < attrValues.size(); ++i)
		{
			cbNeeded += attrValues[i].EncodedSize();
		}

		cbNeeded += GetSizeBytes(cbNeeded) + 1;
		// And next, the sequence 
		cbNeeded += attrType.EncodedSize();
		return (cbData = cbNeeded);
	}